

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

int get_attack_number(CHAR_DATA *ch,int dt)

{
  int iVar1;
  OBJ_DATA *pOVar2;
  int iVar3;
  
  pOVar2 = get_eq_char(ch,(uint)(gsn_dual_wield == dt) * 2 + 0x10);
  if (pOVar2 == (OBJ_DATA *)0x0) {
    iVar3 = (int)ch->dam_type;
  }
  else {
    iVar3 = pOVar2->value[3];
  }
  iVar1 = 1;
  if (iVar3 - 1U < 0x3d) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int get_attack_number(CHAR_DATA *ch, int dt)
{
	OBJ_DATA *wield;
	int tmp_dt;

	/*
		if(is_shifted(ch))
			return attack_lookup(form_table[ch->pcdata->shifted].attack_type);
	*/

	tmp_dt = TYPE_HIT;

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
		tmp_dt += wield->value[3];
	else
		tmp_dt += ch->dam_type;

	if (tmp_dt > TYPE_HIT && tmp_dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		return (tmp_dt - TYPE_HIT);

	return 1;
}